

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::EnableAllJoiners
          (Error *__return_storage_ptr__,CommissionerApp *this,JoinerType aType,string *aPSKd,
          string *aProvisioningUrl)

{
  string *aProvisioningUrl_local;
  string *aPSKd_local;
  JoinerType aType_local;
  CommissionerApp *this_local;
  
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::EnableAllJoiners(JoinerType aType, const std::string &aPSKd, const std::string &aProvisioningUrl)
{
    UNUSED(aType);
    UNUSED(aPSKd);
    UNUSED(aProvisioningUrl);
    return Error{};
}